

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O2

void test_chunk(Chunk *ch)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  FourCC FVar4;
  uint32_t uVar5;
  ostream *poVar6;
  iterator first_it2;
  Chunk second;
  vector<char,_std::allocator<char>_> buffer;
  iterator first_it;
  undefined1 local_128 [20];
  array<char,_4UL> local_114;
  Chunk first2;
  Chunk first;
  Chunk second2;
  Chunk local_f8;
  Chunk local_f0;
  Chunk local_e8;
  Chunk local_e0;
  Chunk local_d8;
  Chunk local_d0;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> chunks;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> subchunks_1;
  vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_> subchunks_2;
  string str3;
  string str2;
  string str1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str1,"hey this is a test",(allocator<char> *)&str2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str2,"hey this is another test",(allocator<char> *)&str3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str3,"final test",(allocator<char> *)&first_it);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  FVar4 = riffcpp::Chunk::id(ch);
  first_it.pimpl._0_1_ = FVar4._M_elems[0];
  first_it.pimpl._1_1_ = FVar4._M_elems[1];
  first_it.pimpl._2_1_ = FVar4._M_elems[2];
  first_it.pimpl._3_1_ = FVar4._M_elems[3];
  bVar1 = std::operator==((array<char,_4UL> *)&first_it,(array<char,_4UL> *)&riffcpp::riff_id);
  if (bVar1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"ch.id() == riffcpp::riff_id (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,10);
    std::operator<<(poVar6,"): OK\n");
    FVar4 = riffcpp::Chunk::type(ch);
    first_it.pimpl._0_1_ = FVar4._M_elems[0];
    first_it.pimpl._1_1_ = FVar4._M_elems[1];
    first_it.pimpl._2_1_ = FVar4._M_elems[2];
    first_it.pimpl._3_1_ = FVar4._M_elems[3];
    bVar1 = std::operator==((array<char,_4UL> *)&first_it,&smpl_id);
    if (bVar1) {
      poVar6 = std::operator<<((ostream *)&std::cout,"ch.type() == smpl_id (");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb);
      std::operator<<(poVar6,"): OK\n");
      bVar1 = SUB81(ch,0);
      riffcpp::Chunk::begin(&local_d0,bVar1);
      riffcpp::Chunk::end(&local_d8);
      std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
      vector<riffcpp::Chunk::iterator,void>
                ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&chunks,
                 (iterator *)&local_d0,(iterator *)&local_d8,(allocator_type *)&first_it);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_d8);
      riffcpp::Chunk::iterator::~iterator((iterator *)&local_d0);
      if ((long)chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)chunks.super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
                super__Vector_impl_data._M_start == 0x10) {
        poVar6 = std::operator<<((ostream *)&std::cout,"chunks.size() == 2 (");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd);
        std::operator<<(poVar6,"): OK\n");
        FVar4 = riffcpp::Chunk::id(chunks.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        first_it.pimpl._0_1_ = FVar4._M_elems[0];
        first_it.pimpl._1_1_ = FVar4._M_elems[1];
        first_it.pimpl._2_1_ = FVar4._M_elems[2];
        first_it.pimpl._3_1_ = FVar4._M_elems[3];
        bVar2 = std::operator==((array<char,_4UL> *)&first_it,(array<char,_4UL> *)&riffcpp::list_id)
        ;
        if (bVar2) {
          poVar6 = std::operator<<((ostream *)&std::cout,"chunks[0].id() == riffcpp::list_id (");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10);
          std::operator<<(poVar6,"): OK\n");
          FVar4 = riffcpp::Chunk::type
                            (chunks.
                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          first_it.pimpl._0_1_ = FVar4._M_elems[0];
          first_it.pimpl._1_1_ = FVar4._M_elems[1];
          first_it.pimpl._2_1_ = FVar4._M_elems[2];
          first_it.pimpl._3_1_ = FVar4._M_elems[3];
          bVar2 = std::operator==((array<char,_4UL> *)&first_it,&tst1_id);
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cout,"chunks[0].type() == tst1_id (");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11);
            std::operator<<(poVar6,"): OK\n");
            riffcpp::Chunk::begin
                      (&local_e0,
                       SUB81(chunks.
                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                             _M_impl.super__Vector_impl_data._M_start,0));
            riffcpp::Chunk::end(&local_e8);
            std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
            vector<riffcpp::Chunk::iterator,void>
                      ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)&subchunks_1,
                       (iterator *)&local_e0,(iterator *)&local_e8,(allocator_type *)&first_it);
            riffcpp::Chunk::iterator::~iterator((iterator *)&local_e8);
            riffcpp::Chunk::iterator::~iterator((iterator *)&local_e0);
            if ((long)subchunks_1.
                      super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)subchunks_1.
                      super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x10) {
              poVar6 = std::operator<<((ostream *)&std::cout,"subchunks_1.size() == 2 (");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x13);
              std::operator<<(poVar6,"): OK\n");
              FVar4 = riffcpp::Chunk::id(subchunks_1.
                                         super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              first_it.pimpl._0_1_ = FVar4._M_elems[0];
              first_it.pimpl._1_1_ = FVar4._M_elems[1];
              first_it.pimpl._2_1_ = FVar4._M_elems[2];
              first_it.pimpl._3_1_ = FVar4._M_elems[3];
              bVar2 = std::operator==((array<char,_4UL> *)&first_it,&test_id);
              if (bVar2) {
                poVar6 = std::operator<<((ostream *)&std::cout,"subchunks_1[0].id() == test_id (");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x14);
                std::operator<<(poVar6,"): OK\n");
                uVar5 = riffcpp::Chunk::size
                                  (subchunks_1.
                                   super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                std::vector<char,_std::allocator<char>_>::resize(&buffer,(ulong)uVar5);
                riffcpp::Chunk::read_data
                          (subchunks_1.
                           super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
                first_it.pimpl = (impl *)local_128;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&first_it,
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
                _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&first_it,&str1);
                std::__cxx11::string::~string((string *)&first_it);
                if (_Var3) {
                  poVar6 = std::operator<<((ostream *)&std::cout,
                                           "std::string(buffer.data(), buffer.size()) == str1 (");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x18);
                  std::operator<<(poVar6,"): OK\n");
                  FVar4 = riffcpp::Chunk::id(subchunks_1.
                                             super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1);
                  first_it.pimpl._0_1_ = FVar4._M_elems[0];
                  first_it.pimpl._1_1_ = FVar4._M_elems[1];
                  first_it.pimpl._2_1_ = FVar4._M_elems[2];
                  first_it.pimpl._3_1_ = FVar4._M_elems[3];
                  bVar2 = std::operator==((array<char,_4UL> *)&first_it,&test_id);
                  if (bVar2) {
                    poVar6 = std::operator<<((ostream *)&std::cout,
                                             "subchunks_1[1].id() == test_id (");
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x19);
                    std::operator<<(poVar6,"): OK\n");
                    uVar5 = riffcpp::Chunk::size
                                      (subchunks_1.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1);
                    std::vector<char,_std::allocator<char>_>::resize(&buffer,(ulong)uVar5);
                    riffcpp::Chunk::read_data
                              (subchunks_1.
                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1,
                               buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
                               (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_start);
                    first_it.pimpl = (impl *)local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&first_it,
                               buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
                               buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish);
                    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&first_it,&str2);
                    std::__cxx11::string::~string((string *)&first_it);
                    if (_Var3) {
                      poVar6 = std::operator<<((ostream *)&std::cout,
                                               "std::string(buffer.data(), buffer.size()) == str2 ("
                                              );
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d);
                      std::operator<<(poVar6,"): OK\n");
                      FVar4 = riffcpp::Chunk::id(chunks.
                                                 super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                      first_it.pimpl._0_1_ = FVar4._M_elems[0];
                      first_it.pimpl._1_1_ = FVar4._M_elems[1];
                      first_it.pimpl._2_1_ = FVar4._M_elems[2];
                      first_it.pimpl._3_1_ = FVar4._M_elems[3];
                      bVar2 = std::operator==((array<char,_4UL> *)&first_it,&seqt_id);
                      if (bVar2) {
                        poVar6 = std::operator<<((ostream *)&std::cout,"chunks[1].id() == seqt_id ("
                                                );
                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f);
                        std::operator<<(poVar6,"): OK\n");
                        riffcpp::Chunk::begin
                                  (&local_f0,
                                   (bool)((char)chunks.
                                                super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                ._M_impl.super__Vector_impl_data._M_start + '\b'));
                        riffcpp::Chunk::end(&local_f8);
                        std::vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>>::
                        vector<riffcpp::Chunk::iterator,void>
                                  ((vector<riffcpp::Chunk,std::allocator<riffcpp::Chunk>> *)
                                   &subchunks_2,(iterator *)&local_f0,(iterator *)&local_f8,
                                   (allocator_type *)&first_it);
                        riffcpp::Chunk::iterator::~iterator((iterator *)&local_f8);
                        riffcpp::Chunk::iterator::~iterator((iterator *)&local_f0);
                        if ((long)subchunks_2.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)subchunks_2.
                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                  ._M_impl.super__Vector_impl_data._M_start == 8) {
                          poVar6 = std::operator<<((ostream *)&std::cout,"subchunks_2.size() == 1 ("
                                                  );
                          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x22);
                          std::operator<<(poVar6,"): OK\n");
                          FVar4 = riffcpp::Chunk::id(subchunks_2.
                                                                                                          
                                                  super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          first_it.pimpl._0_1_ = FVar4._M_elems[0];
                          first_it.pimpl._1_1_ = FVar4._M_elems[1];
                          first_it.pimpl._2_1_ = FVar4._M_elems[2];
                          first_it.pimpl._3_1_ = FVar4._M_elems[3];
                          bVar2 = std::operator==((array<char,_4UL> *)&first_it,&test_id);
                          if (bVar2) {
                            poVar6 = std::operator<<((ostream *)&std::cout,
                                                     "subchunks_2[0].id() == test_id (");
                            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x23);
                            std::operator<<(poVar6,"): OK\n");
                            uVar5 = riffcpp::Chunk::size
                                              (subchunks_2.
                                               super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
                            std::vector<char,_std::allocator<char>_>::resize(&buffer,(ulong)uVar5);
                            riffcpp::Chunk::read_data
                                      (subchunks_2.
                                       super__Vector_base<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       buffer.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start,
                                       (long)buffer.super__Vector_base<char,_std::allocator<char>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)buffer.super__Vector_base<char,_std::allocator<char>_>.
                                             _M_impl.super__Vector_impl_data._M_start);
                            first_it.pimpl = (impl *)local_128;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&first_it,
                                       buffer.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start,
                                       buffer.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish);
                            _Var3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&first_it,&str3);
                            std::__cxx11::string::~string((string *)&first_it);
                            if (_Var3) {
                              poVar6 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "std::string(buffer.data(), buffer.size()) == str3 ("
                                                  );
                              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x27);
                              std::operator<<(poVar6,"): OK\n");
                              riffcpp::Chunk::begin((Chunk *)&first_it,bVar1);
                              riffcpp::Chunk::iterator::operator++
                                        ((iterator *)&second,(int)&first_it);
                              riffcpp::Chunk::iterator::operator*((iterator *)&first);
                              riffcpp::Chunk::iterator::~iterator((iterator *)&second);
                              riffcpp::Chunk::iterator::operator*((iterator *)&second);
                              first_it2.pimpl._0_4_ = riffcpp::Chunk::id(&first);
                              bVar2 = std::operator==((array<char,_4UL> *)&first_it2,
                                                      (array<char,_4UL> *)&riffcpp::list_id);
                              if (bVar2) {
                                poVar6 = std::operator<<((ostream *)&std::cout,
                                                         "first.id() == riffcpp::list_id (");
                                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2e);
                                std::operator<<(poVar6,"): OK\n");
                                first_it2.pimpl._0_4_ = riffcpp::Chunk::type(&first);
                                bVar2 = std::operator==((array<char,_4UL> *)&first_it2,&tst1_id);
                                if (bVar2) {
                                  poVar6 = std::operator<<((ostream *)&std::cout,
                                                           "first.type() == tst1_id (");
                                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f);
                                  std::operator<<(poVar6,"): OK\n");
                                  first_it2.pimpl._0_4_ = riffcpp::Chunk::id(&second);
                                  bVar2 = std::operator==((array<char,_4UL> *)&first_it2,&seqt_id);
                                  if (bVar2) {
                                    poVar6 = std::operator<<((ostream *)&std::cout,
                                                             "second.id() == seqt_id (");
                                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x30);
                                    std::operator<<(poVar6,"): OK\n");
                                    riffcpp::Chunk::begin((Chunk *)&first_it2,bVar1);
                                    riffcpp::Chunk::iterator::operator*((iterator *)&first2);
                                    riffcpp::Chunk::iterator::operator++(&first_it2);
                                    riffcpp::Chunk::iterator::operator*((iterator *)&second2);
                                    local_114._M_elems = (_Type)riffcpp::Chunk::id(&first2);
                                    bVar1 = std::operator==(&local_114,
                                                            (array<char,_4UL> *)&riffcpp::list_id);
                                    if (bVar1) {
                                      poVar6 = std::operator<<((ostream *)&std::cout,
                                                               "first2.id() == riffcpp::list_id (");
                                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x37);
                                      std::operator<<(poVar6,"): OK\n");
                                      local_114._M_elems = (_Type)riffcpp::Chunk::type(&first2);
                                      bVar1 = std::operator==(&local_114,&tst1_id);
                                      if (bVar1) {
                                        poVar6 = std::operator<<((ostream *)&std::cout,
                                                                 "first2.type() == tst1_id (");
                                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x38);
                                        std::operator<<(poVar6,"): OK\n");
                                        local_114._M_elems = (_Type)riffcpp::Chunk::id(&second2);
                                        bVar1 = std::operator==(&local_114,&seqt_id);
                                        if (bVar1) {
                                          poVar6 = std::operator<<((ostream *)&std::cout,
                                                                   "second2.id() == seqt_id (");
                                          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x39);
                                          std::operator<<(poVar6,"): OK\n");
                                          riffcpp::Chunk::~Chunk(&second2);
                                          riffcpp::Chunk::~Chunk(&first2);
                                          riffcpp::Chunk::iterator::~iterator(&first_it2);
                                          riffcpp::Chunk::~Chunk(&second);
                                          riffcpp::Chunk::~Chunk(&first);
                                          riffcpp::Chunk::iterator::~iterator(&first_it);
                                          std::
                                          vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::
                                          ~vector(&subchunks_2);
                                          std::
                                          vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::
                                          ~vector(&subchunks_1);
                                          std::
                                          vector<riffcpp::Chunk,_std::allocator<riffcpp::Chunk>_>::
                                          ~vector(&chunks);
                                          std::_Vector_base<char,_std::allocator<char>_>::
                                          ~_Vector_base(&buffer.
                                                  super__Vector_base<char,_std::allocator<char>_>);
                                          std::__cxx11::string::~string((string *)&str3);
                                          std::__cxx11::string::~string((string *)&str2);
                                          std::__cxx11::string::~string((string *)&str1);
                                          return;
                                        }
                                        poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                 "Assertion failed on line ");
                                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x39);
                                        poVar6 = std::operator<<(poVar6,
                                                  ": second2.id() == seqt_id\n");
                                        poVar6 = std::operator<<(poVar6,"Reason: ");
                                        poVar6 = std::operator<<(poVar6,
                                                  "Subchunk must have \'seqt\' id");
                                        std::operator<<(poVar6,'\n');
                                      }
                                      else {
                                        poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                 "Assertion failed on line ");
                                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x38);
                                        poVar6 = std::operator<<(poVar6,
                                                  ": first2.type() == tst1_id\n");
                                        poVar6 = std::operator<<(poVar6,"Reason: ");
                                        poVar6 = std::operator<<(poVar6,
                                                  "Subchunk must have \'LIST\' id");
                                        std::operator<<(poVar6,'\n');
                                      }
                                    }
                                    else {
                                      poVar6 = std::operator<<((ostream *)&std::cerr,
                                                               "Assertion failed on line ");
                                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x37);
                                      poVar6 = std::operator<<(poVar6,
                                                  ": first2.id() == riffcpp::list_id\n");
                                      poVar6 = std::operator<<(poVar6,"Reason: ");
                                      poVar6 = std::operator<<(poVar6,
                                                  "Subchunk must have \'LIST\' id");
                                      std::operator<<(poVar6,'\n');
                                    }
                                  }
                                  else {
                                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                                             "Assertion failed on line ");
                                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x30);
                                    poVar6 = std::operator<<(poVar6,": second.id() == seqt_id\n");
                                    poVar6 = std::operator<<(poVar6,"Reason: ");
                                    poVar6 = std::operator<<(poVar6,"Subchunk must have \'seqt\' id"
                                                            );
                                    std::operator<<(poVar6,'\n');
                                  }
                                }
                                else {
                                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                                           "Assertion failed on line ");
                                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2f);
                                  poVar6 = std::operator<<(poVar6,": first.type() == tst1_id\n");
                                  poVar6 = std::operator<<(poVar6,"Reason: ");
                                  poVar6 = std::operator<<(poVar6,"Subchunk must have \'LIST\' id");
                                  std::operator<<(poVar6,'\n');
                                }
                              }
                              else {
                                poVar6 = std::operator<<((ostream *)&std::cerr,
                                                         "Assertion failed on line ");
                                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x2e);
                                poVar6 = std::operator<<(poVar6,": first.id() == riffcpp::list_id\n"
                                                        );
                                poVar6 = std::operator<<(poVar6,"Reason: ");
                                poVar6 = std::operator<<(poVar6,"Subchunk must have \'LIST\' id");
                                std::operator<<(poVar6,'\n');
                              }
                            }
                            else {
                              poVar6 = std::operator<<((ostream *)&std::cerr,
                                                       "Assertion failed on line ");
                              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x27);
                              poVar6 = std::operator<<(poVar6,
                                                  ": std::string(buffer.data(), buffer.size()) == str3\n"
                                                  );
                              poVar6 = std::operator<<(poVar6,"Reason: ");
                              poVar6 = std::operator<<(poVar6,"Strings must be equal");
                              std::operator<<(poVar6,'\n');
                            }
                          }
                          else {
                            poVar6 = std::operator<<((ostream *)&std::cerr,
                                                     "Assertion failed on line ");
                            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x23);
                            poVar6 = std::operator<<(poVar6,": subchunks_2[0].id() == test_id\n");
                            poVar6 = std::operator<<(poVar6,"Reason: ");
                            poVar6 = std::operator<<(poVar6,"Subchunk must have \'test\' id");
                            std::operator<<(poVar6,'\n');
                          }
                        }
                        else {
                          poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line "
                                                  );
                          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x22);
                          poVar6 = std::operator<<(poVar6,": subchunks_2.size() == 1\n");
                          poVar6 = std::operator<<(poVar6,"Reason: ");
                          poVar6 = std::operator<<(poVar6,"Subchunk must have one subchunk");
                          std::operator<<(poVar6,'\n');
                        }
                      }
                      else {
                        poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f);
                        poVar6 = std::operator<<(poVar6,": chunks[1].id() == seqt_id\n");
                        poVar6 = std::operator<<(poVar6,"Reason: ");
                        poVar6 = std::operator<<(poVar6,"Subchunk must have \'seqt\' id");
                        std::operator<<(poVar6,'\n');
                      }
                    }
                    else {
                      poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1d);
                      poVar6 = std::operator<<(poVar6,
                                               ": std::string(buffer.data(), buffer.size()) == str2\n"
                                              );
                      poVar6 = std::operator<<(poVar6,"Reason: ");
                      poVar6 = std::operator<<(poVar6,"Strings must be equal");
                      std::operator<<(poVar6,'\n');
                    }
                  }
                  else {
                    poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x19);
                    poVar6 = std::operator<<(poVar6,": subchunks_1[1].id() == test_id\n");
                    poVar6 = std::operator<<(poVar6,"Reason: ");
                    poVar6 = std::operator<<(poVar6,"Subchunk must have \'test\' id");
                    std::operator<<(poVar6,'\n');
                  }
                }
                else {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x18);
                  poVar6 = std::operator<<(poVar6,
                                           ": std::string(buffer.data(), buffer.size()) == str1\n");
                  poVar6 = std::operator<<(poVar6,"Reason: ");
                  poVar6 = std::operator<<(poVar6,"Strings must be equal");
                  std::operator<<(poVar6,'\n');
                }
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x14);
                poVar6 = std::operator<<(poVar6,": subchunks_1[0].id() == test_id\n");
                poVar6 = std::operator<<(poVar6,"Reason: ");
                poVar6 = std::operator<<(poVar6,"Subchunk must have \'test\' id");
                std::operator<<(poVar6,'\n');
              }
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x13);
              poVar6 = std::operator<<(poVar6,": subchunks_1.size() == 2\n");
              poVar6 = std::operator<<(poVar6,"Reason: ");
              poVar6 = std::operator<<(poVar6,"Subchunk must have two subchunks");
              std::operator<<(poVar6,'\n');
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11);
            poVar6 = std::operator<<(poVar6,": chunks[0].type() == tst1_id\n");
            poVar6 = std::operator<<(poVar6,"Reason: ");
            poVar6 = std::operator<<(poVar6,"Subchunk must have \'tst1\' type");
            std::operator<<(poVar6,'\n');
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10);
          poVar6 = std::operator<<(poVar6,": chunks[0].id() == riffcpp::list_id\n");
          poVar6 = std::operator<<(poVar6,"Reason: ");
          poVar6 = std::operator<<(poVar6,"Subchunk must have \'LIST\' id");
          std::operator<<(poVar6,'\n');
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd);
        poVar6 = std::operator<<(poVar6,": chunks.size() == 2\n");
        poVar6 = std::operator<<(poVar6,"Reason: ");
        poVar6 = std::operator<<(poVar6,"Toplevel chunk must contain two subchunks");
        std::operator<<(poVar6,'\n');
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb);
      poVar6 = std::operator<<(poVar6,": ch.type() == smpl_id\n");
      poVar6 = std::operator<<(poVar6,"Reason: ");
      poVar6 = std::operator<<(poVar6,"Expected \'smpl\' chunk");
      std::operator<<(poVar6,'\n');
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Assertion failed on line ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,10);
    poVar6 = std::operator<<(poVar6,": ch.id() == riffcpp::riff_id\n");
    poVar6 = std::operator<<(poVar6,"Reason: ");
    poVar6 = std::operator<<(poVar6,"Toplevel \'RIFF\' id expected");
    std::operator<<(poVar6,'\n');
  }
  exit(1);
}

Assistant:

void test_chunk(riffcpp::Chunk &ch) {
  std::string str1("hey this is a test"), str2("hey this is another test"),
   str3("final test");

  std::vector<char> buffer;

  TEST_ASSERT(ch.id() == riffcpp::riff_id, "Toplevel 'RIFF' id expected");
  TEST_ASSERT(ch.type() == smpl_id, "Expected 'smpl' chunk");
  std::vector<riffcpp::Chunk> chunks{ch.begin(), ch.end()};
  TEST_ASSERT(chunks.size() == 2, "Toplevel chunk must contain two subchunks");

  TEST_ASSERT(chunks[0].id() == riffcpp::list_id,
              "Subchunk must have 'LIST' id");
  TEST_ASSERT(chunks[0].type() == tst1_id, "Subchunk must have 'tst1' type");
  std::vector<riffcpp::Chunk> subchunks_1{chunks[0].begin(), chunks[0].end()};
  TEST_ASSERT(subchunks_1.size() == 2, "Subchunk must have two subchunks");
  TEST_ASSERT(subchunks_1[0].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_1[0].size());
  subchunks_1[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str1,
              "Strings must be equal");
  TEST_ASSERT(subchunks_1[1].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_1[1].size());
  subchunks_1[1].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str2,
              "Strings must be equal");

  TEST_ASSERT(chunks[1].id() == seqt_id, "Subchunk must have 'seqt' id");
  std::vector<riffcpp::Chunk> subchunks_2{chunks[1].begin(true),
                                          chunks[1].end()};
  TEST_ASSERT(subchunks_2.size() == 1, "Subchunk must have one subchunk");
  TEST_ASSERT(subchunks_2[0].id() == test_id, "Subchunk must have 'test' id");
  buffer.resize(subchunks_2[0].size());
  subchunks_2[0].read_data(buffer.data(), buffer.size());
  TEST_ASSERT(std::string(buffer.data(), buffer.size()) == str3,
              "Strings must be equal");

  // Test prefix and postfix increment operators
  auto first_it = ch.begin();
  auto first = *(first_it++);
  auto second = *first_it;

  TEST_ASSERT(first.id() == riffcpp::list_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(first.type() == tst1_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(second.id() == seqt_id, "Subchunk must have 'seqt' id");

  auto first_it2 = ch.begin();
  auto first2 = *first_it2;
  ++first_it2;
  auto second2 = *first_it2;

  TEST_ASSERT(first2.id() == riffcpp::list_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(first2.type() == tst1_id, "Subchunk must have 'LIST' id");
  TEST_ASSERT(second2.id() == seqt_id, "Subchunk must have 'seqt' id");
}